

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void*,unsigned_long>,absl::lts_20250127::container_internal::HashEq<void*,void>::Hash,absl::lts_20250127::container_internal::HashEq<void*,void>::Eq,std::allocator<std::pair<void*const,unsigned_long>>>
::find_or_prepare_insert_soo<void*>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void*,unsigned_long>,absl::lts_20250127::container_internal::HashEq<void*,void>::Hash,absl::lts_20250127::container_internal::HashEq<void*,void>::Eq,std::allocator<std::pair<void*const,unsigned_long>>>
          *this,void **key)

{
  uintptr_t v;
  anon_union_8_1_a8a14541_for_iterator_2 aVar1;
  slot_type *psVar2;
  size_t i;
  bool bVar3;
  ulong uVar4;
  iterator iVar5;
  
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
              *)this);
  if (*(ulong *)(this + 8) < 2) {
    if (*(long *)this != 1) {
      if (*(long *)this == 0) {
        __assert_fail("cap >= kDefaultCapacity",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xb75,
                      "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<void *, unsigned long>, absl::container_internal::HashEq<void *>::Hash, absl::container_internal::HashEq<void *>::Eq, std::allocator<std::pair<void *const, unsigned long>>>::capacity() const [Policy = absl::container_internal::FlatHashMapPolicy<void *, unsigned long>, Hash = absl::container_internal::HashEq<void *>::Hash, Eq = absl::container_internal::HashEq<void *>::Eq, Alloc = std::allocator<std::pair<void *const, unsigned long>>]"
                     );
      }
      __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xe3f,
                    "HashtablezInfoHandle absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<void *, unsigned long>, absl::container_internal::HashEq<void *>::Hash, absl::container_internal::HashEq<void *>::Eq, std::allocator<std::pair<void *const, unsigned long>>>::try_sample_soo() [Policy = absl::container_internal::FlatHashMapPolicy<void *, unsigned long>, Hash = absl::container_internal::HashEq<void *>::Hash, Eq = absl::container_internal::HashEq<void *>::Eq, Alloc = std::allocator<std::pair<void *const, unsigned long>>]"
                   );
    }
    CommonFields::AssertInSooMode((CommonFields *)this);
    *(undefined8 *)(this + 8) = 2;
    aVar1.slot_ = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                  ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                              *)this);
    bVar3 = true;
    iVar5.field_1.slot_ = aVar1.slot_;
    iVar5.ctrl_ = kSooControl;
  }
  else {
    psVar2 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
             ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                         *)this);
    if ((psVar2->value).first == *key) {
      aVar1.slot_ = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                    ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                                *)this);
      iVar5.field_1.slot_ = aVar1.slot_;
      iVar5.ctrl_ = kSooControl;
      bVar3 = false;
    }
    else {
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
      ::resize_impl(this,3);
      uVar4 = ((ulong)*key ^ 0x56e7c8) * -0x234dd359734ecb13;
      uVar4 = ((uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28 |
               uVar4 << 0x38) ^ (ulong)*key) * -0x234dd359734ecb13;
      i = PrepareInsertAfterSoo
                    (uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                     (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                     (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
                     (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38,0x10,(CommonFields *)this);
      iVar5 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
              ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<void_*,_unsigned_long>,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                             *)this,i);
      bVar3 = true;
    }
  }
  __return_storage_ptr__->first = iVar5;
  __return_storage_ptr__->second = bVar3;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_soo(const K& key) {
    if (empty()) {
      const HashtablezInfoHandle infoz = try_sample_soo();
      if (infoz.IsSampled()) {
        resize_with_soo_infoz(infoz);
      } else {
        common().set_full_soo();
        return {soo_iterator(), true};
      }
    } else if (PolicyTraits::apply(EqualElement<K>{key, eq_ref()},
                                   PolicyTraits::element(soo_slot()))) {
      return {soo_iterator(), false};
    } else {
      resize(NextCapacity(SooCapacity()));
    }
    const size_t index =
        PrepareInsertAfterSoo(hash_ref()(key), sizeof(slot_type), common());
    return {iterator_at(index), true};
  }